

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_Boolean HTS_get_token_from_string(char *string,size_t *index,char *buff)

{
  size_t sVar1;
  bool bVar2;
  size_t i;
  char c;
  char *buff_local;
  size_t *index_local;
  char *string_local;
  
  if (string[*index] != '\0') {
    sVar1 = *index;
    *index = sVar1 + 1;
    c = string[sVar1];
    if (c != '\0') {
      while( true ) {
        bVar2 = true;
        if ((c != ' ') && (bVar2 = true, c != '\n')) {
          bVar2 = c == '\t';
        }
        if (!bVar2) {
          i = 0;
          while( true ) {
            bVar2 = false;
            if (((c != ' ') && (bVar2 = false, c != '\n')) && (bVar2 = false, c != '\t')) {
              bVar2 = c != '\0';
            }
            if (!bVar2) break;
            buff[i] = c;
            sVar1 = *index;
            *index = sVar1 + 1;
            c = string[sVar1];
            i = i + 1;
          }
          buff[i] = '\0';
          return '\x01';
        }
        if (c == '\0') break;
        sVar1 = *index;
        *index = sVar1 + 1;
        c = string[sVar1];
      }
    }
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_get_token_from_string(const char *string, size_t * index, char *buff)
{
   char c;
   size_t i;

   c = string[(*index)];
   if (c == '\0')
      return FALSE;
   c = string[(*index)++];
   if (c == '\0')
      return FALSE;
   while (c == ' ' || c == '\n' || c == '\t') {
      if (c == '\0')
         return FALSE;
      c = string[(*index)++];
   }
   for (i = 0; c != ' ' && c != '\n' && c != '\t' && c != '\0'; i++) {
      buff[i] = c;
      c = string[(*index)++];
   }

   buff[i] = '\0';
   return TRUE;
}